

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 262intf.c
# Opt level: O3

UINT8 device_start_ymf262_mame(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  uint clock;
  UINT8 UVar1;
  DEV_DATA DVar2;
  uint rate;
  
  clock = cfg->clock;
  if (cfg->srMode == '\x02') {
    rate = cfg->smplRate;
    if (cfg->smplRate < clock / 0x120) {
      rate = clock / 0x120;
    }
  }
  else {
    rate = clock / 0x120;
    if (cfg->srMode == '\x01') {
      rate = cfg->smplRate;
    }
  }
  DVar2.chipInf = ymf262_init(clock,rate);
  if (DVar2.chipInf == (void *)0x0) {
    UVar1 = 0xff;
  }
  else {
    *(void **)DVar2.chipInf = DVar2.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)DVar2.chipInf;
    retDevInf->sampleRate = rate;
    retDevInf->devDef = &devDef262_MAME;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
    UVar1 = '\0';
  }
  return UVar1;
}

Assistant:

static UINT8 device_start_ymf262_mame(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	void* chip;
	DEV_DATA* devData;
	UINT32 rate;
	
	rate = cfg->clock / 288;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, rate, cfg->smplRate);
	
	chip = ymf262_init(cfg->clock, rate);
	if (chip == NULL)
		return 0xFF;
	
	// YMF262 setup
	//ymf262_set_timer_handler (chip, TimerHandler, chip);
	//ymf262_set_irq_handler   (chip, IRQHandler, chip);
	//ymf262_set_update_handler(chip, stream_update262_mame, chip);
	
	devData = (DEV_DATA*)chip;
	devData->chipInf = chip;
	INIT_DEVINF(retDevInf, devData, rate, &devDef262_MAME);
	return 0x00;
}